

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

void __thiscall relive::ReLiveDB::setPlayed(ReLiveDB *this,Stream *stream)

{
  int iVar1;
  
  if ((stream->_flags & 2) != 0) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 == 0) {
    *(byte *)&stream->_flags = (byte)stream->_flags | 2;
    storage_abi_cxx11_();
    sqlite_orm::internal::storage_t<$86c824a$>::update<relive::Stream>
              (&storage[abi:cxx11]()::_storage_abi_cxx11_,stream);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ReLiveDB::setPlayed(Stream& stream)
{
    if (!(stream._flags & Stream::ePlayed)) {
        std::lock_guard<Mutex> lock{_mutex};
        stream._flags |= Stream::ePlayed;
        storage().update(stream);
    }
}